

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall
glu::sl::ShaderParser::parseShaderCase
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  pointer *this_00;
  ShaderCaseFactory *pSVar1;
  CaseRequirement *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  CaseRequirement *pCVar7;
  ulong uVar8;
  reference pvVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ShaderCaseSpecification local_990;
  value_type local_900;
  undefined1 local_8f8 [8];
  ShaderCaseSpecification spec_3;
  string local_860;
  allocator<char> local_839;
  string local_838;
  ShaderCaseSpecification local_818;
  value_type local_788;
  undefined1 local_780 [8];
  ShaderCaseSpecification spec_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  value_type local_640;
  ShaderSource local_638;
  undefined1 local_610 [8];
  ShaderCaseSpecification spec_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  value_type local_4d0;
  ShaderSource local_4c8;
  undefined1 local_4a0 [8];
  ShaderCaseSpecification spec;
  string local_408;
  reference local_3e8;
  CaseRequirement *requirement_1;
  size_t reqNdx;
  undefined1 local_3d0 [7];
  bool fullGLSLES100Required;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> requiredExts;
  vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> requiredCaps;
  undefined1 local_380 [8];
  ProgramSpecification pipelineProgram;
  CaseRequirement requirement;
  string local_258;
  allocator<char> local_231;
  string local_230;
  string local_210;
  undefined1 local_1f0 [8];
  string source;
  Token token;
  string local_1a8;
  undefined1 local_188 [8];
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
  pipelinePrograms;
  vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> requirements;
  undefined1 local_150 [7];
  bool valueBlockSeen;
  ValueBlock valueBlock;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  geometrySources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tessellationEvalSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tessellationCtrlSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fragmentSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vertexSources;
  string bothSource;
  string description;
  CaseType local_48;
  ExpectResult expectResult;
  GLSLVersion version;
  undefined1 local_38 [8];
  string caseName;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList_local;
  ShaderParser *this_local;
  
  caseName.field_2._8_8_ = shaderNodeList;
  advanceToken(this,TOKEN_CASE);
  std::__cxx11::string::string((string *)local_38,(string *)&this->m_curTokenStr);
  advanceToken(this);
  local_48 = CASETYPE_COMPLETE;
  description.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)(bothSource.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &vertexSources.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&fragmentSources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&tessellationCtrlSources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&tessellationEvalSources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&geometrySources.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&valueBlock.uniforms.
               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  ValueBlock::ValueBlock((ValueBlock *)local_150);
  bVar4 = false;
  std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::vector
            ((vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> *)
             &pipelinePrograms.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::vector
            ((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              *)local_188);
  while (this->m_curToken != TOKEN_END) {
    if (this->m_curToken == TOKEN_DESC) {
      advanceToken(this);
      assumeToken(this,TOKEN_STRING);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      parseStringLiteral_abi_cxx11_(&local_1a8,this,pcVar6);
      std::__cxx11::string::operator=
                ((string *)(bothSource.field_2._M_local_buf + 8),(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      advanceToken(this);
    }
    else if (this->m_curToken == TOKEN_EXPECT) {
      advanceToken(this);
      parseExpectResult(this,(ExpectResult *)(description.field_2._M_local_buf + 0xc));
    }
    else if (this->m_curToken == TOKEN_VALUES) {
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&token,"multiple value blocks",
                   (allocator<char> *)(source.field_2._M_local_buf + 0xf));
        parseError(this,(string *)&token);
        std::__cxx11::string::~string((string *)&token);
        std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xf));
      }
      parseValueBlock(this,(ValueBlock *)local_150);
      bVar4 = true;
    }
    else if (((this->m_curToken == TOKEN_BOTH) || (this->m_curToken == TOKEN_VERTEX)) ||
            (((this->m_curToken == TOKEN_FRAGMENT ||
              ((this->m_curToken == TOKEN_TESSELLATION_CONTROL ||
               (this->m_curToken == TOKEN_TESSELLATION_EVALUATION)))) ||
             (this->m_curToken == TOKEN_GEOMETRY)))) {
      source.field_2._8_4_ = this->m_curToken;
      std::__cxx11::string::string((string *)local_1f0);
      advanceToken(this);
      assumeToken(this,TOKEN_SHADER_SOURCE);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      parseShaderSource_abi_cxx11_(&local_210,this,pcVar6);
      std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      advanceToken(this);
      switch(source.field_2._8_4_) {
      case 0xf:
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,"multiple \'both\' blocks",&local_231);
          parseError(this,&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          std::allocator<char>::~allocator(&local_231);
        }
        std::__cxx11::string::operator=
                  ((string *)
                   &vertexSources.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_1f0);
        break;
      case 0x10:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fragmentSources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1f0);
        break;
      case 0x11:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tessellationCtrlSources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1f0);
        break;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,(char *)0x0,
                   (allocator<char> *)((long)&requirement.requiredCap.referenceValue + 3));
        parseError(this,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&requirement.requiredCap.referenceValue + 3));
        break;
      case 0x2f:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tessellationEvalSources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1f0);
        break;
      case 0x30:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&geometrySources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_1f0);
        break;
      case 0x31:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&valueBlock.uniforms.
                        super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type *)local_1f0);
      }
      std::__cxx11::string::~string((string *)local_1f0);
    }
    else if (this->m_curToken == TOKEN_VERSION) {
      advanceToken(this);
      parseGLSLVersion(this,&local_48);
    }
    else if (this->m_curToken == TOKEN_REQUIRE) {
      CaseRequirement::CaseRequirement((CaseRequirement *)&pipelineProgram.activeStages);
      parseRequirement(this,(CaseRequirement *)&pipelineProgram.activeStages);
      std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::push_back
                ((vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> *)
                 &pipelinePrograms.
                  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (value_type *)&pipelineProgram.activeStages);
      CaseRequirement::~CaseRequirement((CaseRequirement *)&pipelineProgram.activeStages);
    }
    else if (this->m_curToken == TOKEN_PIPELINE_PROGRAM) {
      ProgramSpecification::ProgramSpecification((ProgramSpecification *)local_380);
      parsePipelineProgram(this,(ProgramSpecification *)local_380);
      pipelineProgram.sources.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 1;
      std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
      push_back((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                 *)local_188,(value_type *)local_380);
      ProgramSpecification::~ProgramSpecification((ProgramSpecification *)local_380);
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &requiredCaps.
                      super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     "unexpected token while parsing shader case: ",&this->m_curTokenStr);
      parseError(this,(string *)
                      &requiredCaps.
                       super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &requiredCaps.
                  super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
  }
  advanceToken(this,TOKEN_END);
  std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::vector
            ((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *)
             &requiredExts.
              super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::vector
            ((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
             local_3d0);
  reqNdx._7_1_ = 0;
  for (requirement_1 = (CaseRequirement *)0x0; pCVar2 = requirement_1,
      pCVar7 = (CaseRequirement *)
               std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::
               size((vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> *)
                    &pipelinePrograms.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage), pCVar2 < pCVar7;
      requirement_1 = (CaseRequirement *)((long)&requirement_1->type + 1)) {
    local_3e8 = std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::
                operator[]((vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                            *)&pipelinePrograms.
                               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (size_type)requirement_1);
    if (local_3e8->type == TYPE_EXTENSION) {
      std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
      push_back((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
                local_3d0,&local_3e8->extension);
    }
    else if (local_3e8->type == TYPE_IMPLEMENTATION_LIMIT) {
      std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
      push_back((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *
                )&requiredExts.
                  super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3e8->requiredCap);
    }
    else if (local_3e8->type == TYPE_FULL_GLSL_ES_100_SUPPORT) {
      reqNdx._7_1_ = 1;
    }
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    bVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fragmentSources.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((!bVar4) ||
        (bVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&tessellationCtrlSources.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4)) ||
       ((bVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&tessellationEvalSources.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4 ||
        (((bVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&geometrySources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4 ||
          (bVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&valueBlock.uniforms.
                               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4)) ||
         (bVar4 = std::
                  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                  ::empty((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                           *)local_188), !bVar4)))))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_408,"\'both\' cannot be mixed with other shader stages",
                 (allocator<char> *)
                 ((long)&spec.programs.
                         super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      parseError(this,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&spec.programs.
                         super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    ShaderCaseSpecification::ShaderCaseSpecification((ShaderCaseSpecification *)local_4a0);
    local_4a0._0_4_ = CASETYPE_VERTEX_ONLY;
    local_4a0._4_4_ = description.field_2._12_4_;
    spec.caseType = local_48;
    spec.requiredCaps.
    super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = reqNdx._7_1_ & 1;
    std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
    operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *)
              &spec.targetVersion,
              (vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *)
              &requiredExts.
               super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ValueBlock::operator=((ValueBlock *)&spec.fullGLSLES100Required,(ValueBlock *)local_150);
    std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
    resize((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> *)
           &spec.values.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    pvVar9 = std::
             vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
             operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         *)&spec.values.uniforms.
                            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    VertexSource::VertexSource
              ((VertexSource *)&local_4c8,
               (string *)
               &vertexSources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ProgramSources::operator<<(&pvVar9->sources,&local_4c8);
    VertexSource::~VertexSource((VertexSource *)&local_4c8);
    pvVar9 = std::
             vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
             operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         *)&spec.values.uniforms.
                            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::operator=
              (&pvVar9->requiredExtensions,
               (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
               local_3d0);
    uVar3 = caseName.field_2._8_8_;
    pSVar1 = this->m_caseFactory;
    std::operator+(&local_4f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "_vertex");
    ShaderCaseSpecification::ShaderCaseSpecification
              ((ShaderCaseSpecification *)
               &spec_1.programs.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (ShaderCaseSpecification *)local_4a0);
    iVar5 = (*pSVar1->_vptr_ShaderCaseFactory[1])
                      (pSVar1,&local_4f0,(undefined1 *)((long)&bothSource.field_2 + 8),
                       &spec_1.programs.
                        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_4d0 = (value_type)CONCAT44(extraout_var,iVar5);
    std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
              ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)uVar3,&local_4d0);
    ShaderCaseSpecification::~ShaderCaseSpecification
              ((ShaderCaseSpecification *)
               &spec_1.programs.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_4f0);
    ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)local_4a0);
    ShaderCaseSpecification::ShaderCaseSpecification((ShaderCaseSpecification *)local_610);
    local_610._0_4_ = CASETYPE_FRAGMENT_ONLY;
    local_610._4_4_ = description.field_2._12_4_;
    spec_1.caseType = local_48;
    spec_1.requiredCaps.
    super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = reqNdx._7_1_ & 1;
    std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
    operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *)
              &spec_1.targetVersion,
              (vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *)
              &requiredExts.
               super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ValueBlock::operator=((ValueBlock *)&spec_1.fullGLSLES100Required,(ValueBlock *)local_150);
    std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
    resize((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> *)
           &spec_1.values.uniforms.
            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,1);
    pvVar9 = std::
             vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
             operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         *)&spec_1.values.uniforms.
                            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    FragmentSource::FragmentSource
              ((FragmentSource *)&local_638,
               (string *)
               &vertexSources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ProgramSources::operator<<(&pvVar9->sources,&local_638);
    FragmentSource::~FragmentSource((FragmentSource *)&local_638);
    pvVar9 = std::
             vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
             operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         *)&spec_1.values.uniforms.
                            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,0);
    std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::operator=
              (&pvVar9->requiredExtensions,
               (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
               local_3d0);
    uVar3 = caseName.field_2._8_8_;
    pSVar1 = this->m_caseFactory;
    std::operator+(&local_660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                   "_fragment");
    ShaderCaseSpecification::ShaderCaseSpecification
              ((ShaderCaseSpecification *)
               &spec_2.programs.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (ShaderCaseSpecification *)local_610);
    iVar5 = (*pSVar1->_vptr_ShaderCaseFactory[1])
                      (pSVar1,&local_660,(undefined1 *)((long)&bothSource.field_2 + 8),
                       &spec_2.programs.
                        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_640 = (value_type)CONCAT44(extraout_var_00,iVar5);
    std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
              ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)uVar3,&local_640);
    ShaderCaseSpecification::~ShaderCaseSpecification
              ((ShaderCaseSpecification *)
               &spec_2.programs.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_660);
    ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)local_610);
  }
  else {
    bVar4 = std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            empty((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                   *)local_188);
    if (bVar4) {
      ShaderCaseSpecification::ShaderCaseSpecification((ShaderCaseSpecification *)local_780);
      local_780._0_4_ = CASETYPE_COMPLETE;
      local_780._4_4_ = description.field_2._12_4_;
      spec_2.caseType = local_48;
      spec_2.requiredCaps.
      super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = reqNdx._7_1_ & 1;
      std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
      operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *
                )&spec_2.targetVersion,
                (vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *
                )&requiredExts.
                  super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ValueBlock::operator=((ValueBlock *)&spec_2.fullGLSLES100Required,(ValueBlock *)local_150);
      std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
      resize((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              *)&spec_2.values.uniforms.
                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,1);
      this_00 = &spec_2.values.uniforms.
                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar9 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                             *)this_00,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::swap((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pvVar9,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&fragmentSources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar9 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                             *)this_00,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::swap((pvVar9->sources).sources + 1,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tessellationCtrlSources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar9 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                             *)this_00,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::swap((pvVar9->sources).sources + 3,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&tessellationEvalSources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar9 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                             *)this_00,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::swap((pvVar9->sources).sources + 4,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&geometrySources.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar9 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                             *)this_00,0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::swap((pvVar9->sources).sources + 2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&valueBlock.uniforms.
                 super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      pvVar9 = std::
               vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ::operator[]((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                             *)this_00,0);
      std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::swap
                (&pvVar9->requiredExtensions,
                 (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
                 local_3d0);
      uVar3 = caseName.field_2._8_8_;
      pSVar1 = this->m_caseFactory;
      ShaderCaseSpecification::ShaderCaseSpecification
                (&local_818,(ShaderCaseSpecification *)local_780);
      iVar5 = (*pSVar1->_vptr_ShaderCaseFactory[1])
                        (pSVar1,local_38,(undefined1 *)((long)&bothSource.field_2 + 8),&local_818);
      local_788 = (value_type)CONCAT44(extraout_var_01,iVar5);
      std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)uVar3,&local_788);
      ShaderCaseSpecification::~ShaderCaseSpecification(&local_818);
      ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)local_780);
    }
    else {
      bVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&fragmentSources.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((((!bVar4) ||
           (bVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&tessellationCtrlSources.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4)) ||
          (bVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&tessellationEvalSources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4)) ||
         ((bVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&geometrySources.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4 ||
          (bVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&valueBlock.uniforms.
                               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage), !bVar4)))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_838,"pipeline programs cannot be mixed with complete programs",
                   &local_839);
        parseError(this,&local_838);
        std::__cxx11::string::~string((string *)&local_838);
        std::allocator<char>::~allocator(&local_839);
      }
      bVar4 = std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
              empty((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                     *)local_3d0);
      if (!bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_860,
                   "global extension requirements cannot be mixed with pipeline programs",
                   (allocator<char> *)
                   ((long)&spec_3.programs.
                           super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        parseError(this,&local_860);
        std::__cxx11::string::~string((string *)&local_860);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&spec_3.programs.
                           super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      ShaderCaseSpecification::ShaderCaseSpecification((ShaderCaseSpecification *)local_8f8);
      local_8f8._0_4_ = CASETYPE_COMPLETE;
      local_8f8._4_4_ = description.field_2._12_4_;
      spec_3.caseType = local_48;
      spec_3.requiredCaps.
      super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = reqNdx._7_1_ & 1;
      std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
      operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *
                )&spec_3.targetVersion,
                (vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *
                )&requiredExts.
                  super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ValueBlock::operator=((ValueBlock *)&spec_3.fullGLSLES100Required,(ValueBlock *)local_150);
      std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
      swap((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> *)
           &spec_3.values.uniforms.
            super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage,
           (vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> *)
           local_188);
      uVar3 = caseName.field_2._8_8_;
      pSVar1 = this->m_caseFactory;
      ShaderCaseSpecification::ShaderCaseSpecification
                (&local_990,(ShaderCaseSpecification *)local_8f8);
      iVar5 = (*pSVar1->_vptr_ShaderCaseFactory[1])
                        (pSVar1,local_38,(undefined1 *)((long)&bothSource.field_2 + 8),&local_990);
      local_900 = (value_type)CONCAT44(extraout_var_02,iVar5);
      std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::push_back
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)uVar3,&local_900);
      ShaderCaseSpecification::~ShaderCaseSpecification(&local_990);
      ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)local_8f8);
    }
  }
  std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::~vector
            ((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
             local_3d0);
  std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::~vector
            ((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> *)
             &requiredExts.
              super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
  ~vector((vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> *)
          local_188);
  std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::~vector
            ((vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> *)
             &pipelinePrograms.
              super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ValueBlock::~ValueBlock((ValueBlock *)local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&valueBlock.uniforms.
                super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&geometrySources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tessellationEvalSources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&tessellationCtrlSources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&fragmentSources.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string
            ((string *)
             &vertexSources.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(bothSource.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ShaderParser::parseShaderCase (vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderCase()\n"));
	advanceToken(TOKEN_CASE);

	// Parse case name.
	string caseName = m_curTokenStr;
	advanceToken(); // \note [pyry] All token types are allowed here.

	// \todo [pyry] Optimize by parsing most stuff directly to ShaderCaseSpecification

	// Setup case.
	GLSLVersion						version			= DEFAULT_GLSL_VERSION;
	ExpectResult					expectResult	= EXPECT_PASS;
	string							description;
	string							bothSource;
	vector<string>					vertexSources;
	vector<string>					fragmentSources;
	vector<string>					tessellationCtrlSources;
	vector<string>					tessellationEvalSources;
	vector<string>					geometrySources;
	ValueBlock						valueBlock;
	bool							valueBlockSeen	= false;
	vector<CaseRequirement>			requirements;
	vector<ProgramSpecification>	pipelinePrograms;

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_DESC)
		{
			advanceToken();
			assumeToken(TOKEN_STRING);
			description = parseStringLiteral(m_curTokenStr.c_str());
			advanceToken();
		}
		else if (m_curToken == TOKEN_EXPECT)
		{
			advanceToken();
			parseExpectResult(expectResult);
		}
		else if (m_curToken == TOKEN_VALUES)
		{
			if (valueBlockSeen)
				parseError("multiple value blocks");
			parseValueBlock(valueBlock);
			valueBlockSeen = true;
		}
		else if (m_curToken == TOKEN_BOTH						||
				 m_curToken == TOKEN_VERTEX						||
				 m_curToken == TOKEN_FRAGMENT					||
				 m_curToken == TOKEN_TESSELLATION_CONTROL		||
				 m_curToken == TOKEN_TESSELLATION_EVALUATION	||
				 m_curToken == TOKEN_GEOMETRY)
		{
			const Token	token = m_curToken;
			string		source;

			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();

			switch (token)
			{
				case TOKEN_VERTEX:					vertexSources.push_back(source);			break;
				case TOKEN_FRAGMENT:				fragmentSources.push_back(source);			break;
				case TOKEN_TESSELLATION_CONTROL:	tessellationCtrlSources.push_back(source);	break;
				case TOKEN_TESSELLATION_EVALUATION:	tessellationEvalSources.push_back(source);	break;
				case TOKEN_GEOMETRY:				geometrySources.push_back(source);			break;
				case TOKEN_BOTH:
				{
					if (!bothSource.empty())
						parseError("multiple 'both' blocks");
					bothSource = source;
					break;
				}

				default:
					parseError(DE_FALSE);
			}
		}
		else if (m_curToken == TOKEN_VERSION)
		{
			advanceToken();
			parseGLSLVersion(version);
		}
		else if (m_curToken == TOKEN_REQUIRE)
		{
			CaseRequirement requirement;
			parseRequirement(requirement);
			requirements.push_back(requirement);
		}
		else if (m_curToken == TOKEN_PIPELINE_PROGRAM)
		{
			ProgramSpecification pipelineProgram;
			parsePipelineProgram(pipelineProgram);
			pipelineProgram.sources.separable = true;
			pipelinePrograms.push_back(pipelineProgram);
		}
		else
			parseError(string("unexpected token while parsing shader case: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // case end

	// \todo [pyry] Clean up
	vector<RequiredCapability>	requiredCaps;
	vector<RequiredExtension>	requiredExts;
	bool						fullGLSLES100Required	= false;

	for (size_t reqNdx = 0; reqNdx < requirements.size(); ++reqNdx)
	{
		const CaseRequirement&	requirement	= requirements[reqNdx];

		if (requirement.type == CaseRequirement::TYPE_EXTENSION)
			requiredExts.push_back(requirement.extension);
		else if (requirement.type == CaseRequirement::TYPE_IMPLEMENTATION_LIMIT)
			requiredCaps.push_back(requirement.requiredCap);
		else if (requirement.type == CaseRequirement::TYPE_FULL_GLSL_ES_100_SUPPORT)
			fullGLSLES100Required = true;
		else
			DE_ASSERT(false);
	}

	if (!bothSource.empty())
	{
		if (!vertexSources.empty()				||
			!fragmentSources.empty()			||
			!tessellationCtrlSources.empty()	||
			!tessellationEvalSources.empty()	||
			!geometrySources.empty()			||
			!pipelinePrograms.empty())
		{
			parseError("'both' cannot be mixed with other shader stages");
		}

		// vertex
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_VERTEX_ONLY;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.resize(1);
			spec.programs[0].sources << VertexSource(bothSource);
			spec.programs[0].requiredExtensions	= requiredExts;

			shaderNodeList.push_back(m_caseFactory->createCase(caseName + "_vertex", description, ShaderCaseSpecification(spec)));
		}

		// fragment
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_FRAGMENT_ONLY;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.resize(1);
			spec.programs[0].sources << FragmentSource(bothSource);
			spec.programs[0].requiredExtensions	= requiredExts;

			shaderNodeList.push_back(m_caseFactory->createCase(caseName + "_fragment", description, ShaderCaseSpecification(spec)));
		}
	}
	else if (pipelinePrograms.empty())
	{
		ShaderCaseSpecification	spec;
		spec.caseType				= CASETYPE_COMPLETE;
		spec.expectResult			= expectResult;
		spec.targetVersion			= version;
		spec.fullGLSLES100Required	= fullGLSLES100Required;
		spec.requiredCaps			= requiredCaps;
		spec.values					= valueBlock;

		spec.programs.resize(1);
		spec.programs[0].sources.sources[SHADERTYPE_VERTEX].swap(vertexSources);
		spec.programs[0].sources.sources[SHADERTYPE_FRAGMENT].swap(fragmentSources);
		spec.programs[0].sources.sources[SHADERTYPE_TESSELLATION_CONTROL].swap(tessellationCtrlSources);
		spec.programs[0].sources.sources[SHADERTYPE_TESSELLATION_EVALUATION].swap(tessellationEvalSources);
		spec.programs[0].sources.sources[SHADERTYPE_GEOMETRY].swap(geometrySources);
		spec.programs[0].requiredExtensions.swap(requiredExts);

		shaderNodeList.push_back(m_caseFactory->createCase(caseName, description, ShaderCaseSpecification(spec)));
	}
	else
	{
		if (!vertexSources.empty()				||
			!fragmentSources.empty()			||
			!tessellationCtrlSources.empty()	||
			!tessellationEvalSources.empty()	||
			!geometrySources.empty())
		{
			parseError("pipeline programs cannot be mixed with complete programs");
		}

		if (!requiredExts.empty())
			parseError("global extension requirements cannot be mixed with pipeline programs");

		// Pipeline case, multiple programs
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_COMPLETE;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.swap(pipelinePrograms);

			shaderNodeList.push_back(m_caseFactory->createCase(caseName, description, ShaderCaseSpecification(spec)));
		}
	}
}